

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparser.cpp
# Opt level: O1

int __thiscall argparser::getopt(argparser *this,int ___argc,char **___argv,char *__shortopts)

{
  char **ppcVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  undefined4 in_register_00000034;
  long *plVar5;
  char **ppcVar6;
  string arg;
  char *local_70;
  long local_68;
  char local_60;
  undefined7 uStack_5f;
  long *local_50 [2];
  long local_40 [2];
  
  plVar5 = (long *)CONCAT44(in_register_00000034,___argc);
  if ((long)(this->argv).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->argv).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5 == (ulong)this->optind) {
    return -1;
  }
  local_68 = 0;
  local_60 = '\0';
  local_70 = &local_60;
  std::__cxx11::string::_M_assign((string *)&local_70);
  iVar4 = -1;
  if ((*local_70 == '-') && (local_68 != 1)) {
    this->optind = this->optind + 1;
    iVar2 = std::__cxx11::string::compare((ulong)&local_70,0,(char *)0x2);
    if (iVar2 == 0) {
      if ((local_68 != 2) && (iVar4 = 0x3f, *___argv != (char *)0x0)) {
        ppcVar6 = ___argv + 1;
        do {
          iVar2 = std::__cxx11::string::compare((ulong)&local_70,2,(char *)0xffffffffffffffff);
          if (iVar2 == 0) {
            iVar4 = *(int *)(ppcVar6 + 2);
            if (*(int *)ppcVar6 != 0) {
              if ((ulong)this->optind <
                  (ulong)((long)(this->argv).
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->argv).
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
                this->optind = this->optind + 1;
                std::__cxx11::string::_M_assign((string *)this);
                if (*(this->optarg)._M_dataplus._M_p != '-') goto LAB_00106913;
              }
              (this->optarg)._M_string_length = 0;
              *(this->optarg)._M_dataplus._M_p = '\0';
              this->optind = this->optind - 1;
              if (*(int *)ppcVar6 == 1) {
                iVar4 = 0x3a;
              }
            }
LAB_00106913:
            if ((int *)ppcVar6[1] != (int *)0x0) {
              *(int *)ppcVar6[1] = *(int *)(ppcVar6 + 2);
              iVar4 = 0;
            }
            break;
          }
          ppcVar1 = ppcVar6 + 3;
          ppcVar6 = ppcVar6 + 4;
        } while (*ppcVar1 != (char *)0x0);
      }
    }
    else {
      iVar4 = 0x3f;
      if ((plVar5 != (long *)0x0) &&
         (iVar2 = std::__cxx11::string::compare((ulong)&local_70,0,(char *)0x1), iVar2 == 0)) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_70);
        uVar3 = std::__cxx11::string::find((char *)plVar5,(ulong)local_50[0],0);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if (uVar3 != 0xffffffffffffffff) {
          iVar4 = (int)*(char *)(*plVar5 + uVar3);
          if ((uVar3 < (ulong)plVar5[1]) && ((*(byte *)(uVar3 + 1 + *plVar5) & 0xfe) == 0x3a)) {
            if ((ulong)this->optind <
                (ulong)((long)(this->argv).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->argv).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5)) {
              this->optind = this->optind + 1;
              std::__cxx11::string::_M_assign((string *)this);
              if (*(this->optarg)._M_dataplus._M_p != '-') goto LAB_00106926;
            }
            (this->optarg)._M_string_length = 0;
            *(this->optarg)._M_dataplus._M_p = '\0';
            this->optind = this->optind - 1;
            if (*(char *)(*plVar5 + 1 + uVar3) == ':') {
              iVar4 = 0x3a;
            }
          }
        }
      }
    }
  }
LAB_00106926:
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return iVar4;
}

Assistant:

int
argparser::getopt(string* shortopts, const struct option* longopts,
                  int* /*longindex*/)
{
    if (optind == argv.size())
        return -1;

    string arg;
    arg = argv[optind];
    if (arg[0] != '-' || (arg[0] == '-' && arg.size() == 1))
        return -1;
    optind++;

    int retval = '?';
    if (arg.compare(0, 2, "--") == 0) {
        if (arg.size() == 2) return -1; // " -- " separates options and files
        const struct option* opt = longopts;
        while (opt->name != nullptr) {
            if (arg.compare(2, string::npos, opt->name) == 0) {
                retval = opt->val;
                if (opt->has_arg != option::no_argument) {
                    if (optind >= argv.size() || (optarg = argv[optind++])[0] == '-') {
                        optarg.clear();
                        optind--;
                        if (opt->has_arg == option::required_argument)
                            retval = ':';
                    }
                }
                if (opt->flag != nullptr) {
                    *opt->flag = opt->val;
                    retval = 0;
                }
                break;
            }
            opt++;
        }
    } else if (shortopts != nullptr && arg.compare(0, 1, "-") == 0) {
        size_t pos = shortopts->find(arg.substr(1, 1));
        if (pos != string::npos) {
            retval = (*shortopts)[pos];
            if (pos < shortopts->length()
                && ((*shortopts)[++pos] == ':' || (*shortopts)[pos] == ';')) {
                if (optind >= argv.size() || (optarg = argv[optind++])[0] == '-') {
                    optarg.clear();
                    optind--;
                    if ((*shortopts)[pos] == ':') // required argument
                    retval = ':';
                }
            }
        }
    }

    return retval;
}